

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scv.c
# Opt level: O0

scv_vector * scv_new(size_t objsize,size_t capacity)

{
  undefined1 auVar1 [16];
  void *pvVar2;
  scv_vector *v;
  size_t capacity_local;
  size_t objsize_local;
  
  v = (scv_vector *)capacity;
  if (capacity == 0) {
    v = (scv_vector *)0x1;
  }
  if ((objsize == 0) ||
     (auVar1._8_8_ = 0, auVar1._0_8_ = objsize,
     SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0) <= v)) {
    objsize_local = 0;
  }
  else {
    objsize_local = (size_t)malloc(0x20);
    if ((long *)objsize_local == (long *)0x0) {
      objsize_local = 0;
    }
    else {
      if ((long)v * objsize < 0x40) {
        v = (scv_vector *)((objsize + 0x3f) / objsize);
      }
      pvVar2 = malloc((long)v * objsize);
      *(void **)objsize_local = pvVar2;
      if (*(long *)objsize_local == 0) {
        free((void *)objsize_local);
        objsize_local = 0;
      }
      else {
        *(size_t *)(objsize_local + 8) = objsize;
        *(long *)(objsize_local + 0x10) = 0;
        *(scv_vector **)(objsize_local + 0x18) = v;
      }
    }
  }
  return (scv_vector *)objsize_local;
}

Assistant:

struct scv_vector *scv_new(size_t objsize, size_t capacity)
{
	struct scv_vector *v;

	if (capacity == 0) {
		capacity = 1;
	}

	if (objsize == 0 || capacity >= (size_t) -1 / objsize) {
		return NULL;
	}

	v = (struct scv_vector *) malloc(sizeof *v);

	if (v == NULL) {
		return NULL;
	}

	/* Minimum capacity is SCV_MIN_ALLOC bytes or 1 element */
	if (capacity * objsize < SCV_MIN_ALLOC) {
		capacity = (SCV_MIN_ALLOC + (objsize - 1)) / objsize;
	}

	v->data = malloc(capacity * objsize);

	if (v->data == NULL) {
		free(v);
		return NULL;
	}

	v->objsize = objsize;
	v->size = 0;
	v->capacity = capacity;

	return v;
}